

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,char *significand,
          int significand_size,int integral_size,char8_t decimal_point)

{
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *this;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> local_48;
  buffer<char8_t> *local_40;
  buffer<char8_t> *local_38;
  char local_29;
  int local_28;
  int iStack_24;
  char8_t decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  char *significand_local;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out_local;
  
  local_40 = out.container;
  local_29 = decimal_point;
  local_28 = integral_size;
  iStack_24 = significand_size;
  _integral_size_local = significand;
  significand_local = (char *)out.container;
  local_38 = (buffer<char8_t> *)
             copy_str_noinline<char8_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                       (significand,significand + integral_size,out);
  out_local = (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)local_38;
  if (local_29 != '\0') {
    significand_local = (char *)local_38;
    local_48 = std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::operator++
                         ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *)
                          &significand_local,0);
    this = std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::operator*(&local_48);
    std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::operator=(this,&local_29);
    out_local = copy_str_noinline<char8_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                          (_integral_size_local + local_28,_integral_size_local + iStack_24,
                           (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)
                           significand_local);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out_local.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_str_noinline<Char>(significand,
                                        significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str_noinline<Char>(significand + integral_size,
                                         significand + significand_size, out);
}